

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serialize.cpp
# Opt level: O0

void writeStringLength(uint64_t value,ostream *stream)

{
  byte local_19;
  ostream *poStack_18;
  uchar c;
  ostream *stream_local;
  uint64_t value_local;
  
  poStack_18 = stream;
  for (stream_local = (ostream *)value; local_19 = (byte)stream_local,
      (ostream *)0x7f < stream_local; stream_local = (ostream *)((ulong)stream_local >> 7)) {
    local_19 = local_19 & 0x7f | 0x80;
    std::ostream::write((char *)poStack_18,(long)&local_19);
  }
  std::ostream::write((char *)poStack_18,(long)&local_19);
  return;
}

Assistant:

void writeStringLength(uint64_t value, std::ostream & stream)
{
  /*
   *  Length bits are saved in an array of unsigned char
   *  shaped like this: 1xxxxxxx 1xxxxxxx 1xxxxxxx 0xxxxxxx
   *  Most significant bit means:
   *    - 1 for more bytes to come
   *    - 0 for the last byte
   *  (Strings with length <= 127 only have a 1 byte prefix)
   */
  unsigned char c;
  while (value > 127) {
    c = (value & 0x7F) | 128;
    stream.write(reinterpret_cast<char *>(&c), 1);
    value >>= 7;
  }
  c = value;
  stream.write(reinterpret_cast<char *>(&c), 1);
}